

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Vec3<double>_>::writeValueTo
          (TypedAttribute<Imath_2_5::Vec3<double>_> *this,OStream *os,int version)

{
  undefined4 in_EDX;
  OStream *in_RSI;
  undefined4 in_stack_ffffffffffffffe8;
  
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            (in_RSI,(double)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            (in_RSI,(double)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            (in_RSI,(double)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

void
V3dAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.x);
    Xdr::write <StreamIO> (os, _value.y);
    Xdr::write <StreamIO> (os, _value.z);
}